

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

int __thiscall
testing::internal::ParameterizedTestSuiteInfo<CalendarFixture>::AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<CalendarFixture> *this,string *instantiation_name,
          GeneratorCreationFunc *func,ParamNameGeneratorFunc *name_func,char *file,int line)

{
  InstantiationInfo local_78;
  int local_34;
  char *pcStack_30;
  int line_local;
  char *file_local;
  ParamNameGeneratorFunc *name_func_local;
  GeneratorCreationFunc *func_local;
  string *instantiation_name_local;
  ParameterizedTestSuiteInfo<CalendarFixture> *this_local;
  
  local_34 = line;
  pcStack_30 = file;
  file_local = (char *)name_func;
  name_func_local = (ParamNameGeneratorFunc *)func;
  func_local = (GeneratorCreationFunc *)instantiation_name;
  instantiation_name_local = (string *)this;
  InstantiationInfo::InstantiationInfo(&local_78,instantiation_name,func,name_func,file,line);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<CalendarFixture>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CalendarFixture>::InstantiationInfo>_>
  ::push_back(&this->instantiations_,&local_78);
  InstantiationInfo::~InstantiationInfo(&local_78);
  return 0;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }